

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.h
# Opt level: O0

void __thiscall SNMPPacket::SNMPPacket(SNMPPacket *this,SNMPPacket *packet)

{
  bool bVar1;
  SNMPPacket *packet_local;
  SNMPPacket *this_local;
  
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_0013c748;
  this->reuse = false;
  std::shared_ptr<IntegerType>::shared_ptr(&this->requestIDPtr,(nullptr_t)0x0);
  std::shared_ptr<IntegerType>::shared_ptr(&this->snmpVersionPtr,(nullptr_t)0x0);
  std::shared_ptr<OctetType>::shared_ptr(&this->communityStringPtr,(nullptr_t)0x0);
  this->requestID = 0;
  this->snmpVersion = SNMP_VERSION_1;
  std::__cxx11::string::string((string *)&this->communityString);
  std::deque<VarBind,_std::allocator<VarBind>_>::deque(&this->varbindList);
  (this->errorStatus).errorStatus = NO_ERROR;
  (this->errorIndex).errorIndex = 0;
  this->packet = (ComplexType *)0x0;
  setRequestID(this,packet->requestID);
  setVersion(this,packet->snmpVersion);
  setCommunityString(this,&packet->communityString);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&packet->requestIDPtr);
  if (bVar1) {
    std::shared_ptr<IntegerType>::operator=(&this->requestIDPtr,&packet->requestIDPtr);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&packet->snmpVersionPtr);
  if (bVar1) {
    std::shared_ptr<IntegerType>::operator=(&this->snmpVersionPtr,&packet->snmpVersionPtr);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&packet->communityStringPtr);
  if (bVar1) {
    std::shared_ptr<OctetType>::operator=(&this->communityStringPtr,&packet->communityStringPtr);
  }
  return;
}

Assistant:

explicit SNMPPacket(const SNMPPacket& packet){
        this->setRequestID(packet.requestID);
        this->setVersion(packet.snmpVersion);
        this->setCommunityString(packet.communityString);

        // Provide reusable ASN containers if required
        if(packet.requestIDPtr){
            this->requestIDPtr = packet.requestIDPtr;
        }

        if(packet.snmpVersionPtr){
            this->snmpVersionPtr = packet.snmpVersionPtr;
        }

        if(packet.communityStringPtr){
            this->communityStringPtr = packet.communityStringPtr;
        }
    }